

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

ELEMENT_TYPE * getElementType(XML_Parser parser,ENCODING *enc,char *ptr,char *end)

{
  int iVar1;
  XML_Char *name;
  ELEMENT_TYPE *elementType;
  
  name = poolStoreString((STRING_POOL *)((long)parser + 0x330),enc,ptr,end);
  if ((name != (XML_Char *)0x0) &&
     (elementType = (ELEMENT_TYPE *)lookup((HASH_TABLE *)((long)parser + 0x2b8),name,0x28),
     elementType != (ELEMENT_TYPE *)0x0)) {
    if (elementType->name != name) {
      *(undefined8 *)((long)parser + 0x348) = *(undefined8 *)((long)parser + 0x350);
      return elementType;
    }
    *(undefined8 *)((long)parser + 0x350) = *(undefined8 *)((long)parser + 0x348);
    iVar1 = setElementTypePrefix(parser,elementType);
    if (iVar1 != 0) {
      return elementType;
    }
  }
  return (ELEMENT_TYPE *)0x0;
}

Assistant:

static ELEMENT_TYPE *
getElementType(XML_Parser parser,
               const ENCODING *enc,
               const char *ptr,
               const char *end)
{
  const XML_Char *name = poolStoreString(&dtd.pool, enc, ptr, end);
  ELEMENT_TYPE *ret;

  if (! name)
    return 0;
  ret = (ELEMENT_TYPE *) lookup(&dtd.elementTypes, name, sizeof(ELEMENT_TYPE));
  if (! ret)
    return 0;
  if (ret->name != name)
    poolDiscard(&dtd.pool);
  else {
    poolFinish(&dtd.pool);
    if (!setElementTypePrefix(parser, ret))
      return 0;
  }
  return ret;
}